

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_htmlspecialchars(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  char *zString;
  int iVar2;
  bool bVar3;
  int local_48;
  int c;
  int nLen;
  int iFlags;
  char *zEnd;
  char *zIn;
  char *zCur;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  c = 0x41;
  zCur = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar2 = jx9_value_is_string(*apArg), iVar2 == 0)) {
    jx9_result_null(pjStack_18);
  }
  else {
    zEnd = jx9_value_to_string(*(jx9_value **)zCur,&local_48);
    _nLen = zEnd + local_48;
    if ((1 < apArg_local._4_4_) && (c = jx9_value_to_int(*(jx9_value **)(zCur + 8)), c < 0)) {
      c = 0x41;
    }
    for (; zString = zEnd, zEnd < _nLen; zEnd = zEnd + 1) {
      zIn = zEnd;
      while( true ) {
        bVar3 = false;
        if ((((zEnd < _nLen) && (bVar3 = false, *zEnd != '&')) && (bVar3 = false, *zEnd != '\'')) &&
           ((bVar3 = false, *zEnd != '\"' && (bVar3 = false, *zEnd != '<')))) {
          bVar3 = *zEnd != '>';
        }
        if (!bVar3) break;
        zEnd = zEnd + 1;
      }
      if (zString < zEnd) {
        jx9_result_string(pjStack_18,zString,(int)zEnd - (int)zString);
      }
      if (_nLen <= zEnd) {
        return 0;
      }
      cVar1 = *zEnd;
      if (cVar1 == '&') {
        jx9_result_string(pjStack_18,"&amp;",5);
      }
      else if (cVar1 == '<') {
        jx9_result_string(pjStack_18,"&lt;",4);
      }
      else if (cVar1 == '>') {
        jx9_result_string(pjStack_18,"&gt;",4);
      }
      else if (cVar1 == '\'') {
        if ((c & 2U) == 0) {
          jx9_result_string(pjStack_18,"\'",1);
        }
        else {
          jx9_result_string(pjStack_18,"&#039;",6);
        }
      }
      else if (cVar1 == '\"') {
        if ((c & 4U) == 0) {
          jx9_result_string(pjStack_18,"&quot;",6);
        }
        else {
          jx9_result_string(pjStack_18,"\"",1);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_htmlspecialchars(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zCur, *zIn, *zEnd;
	int iFlags = 0x01|0x40; /* ENT_COMPAT | ENT_HTML401 */
	int nLen, c;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	/* Extract the flags if available */
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
		if( iFlags < 0 ){
			iFlags = 0x01|0x40;
		}
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			break;
		}
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '&' && zIn[0] != '\'' && zIn[0] != '"' && zIn[0] != '<' && zIn[0] != '>' ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Append the raw string verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
		if( zIn >= zEnd ){
			break;
		}
		c = zIn[0];
		if( c == '&' ){
			/* Expand '&amp;' */
			jx9_result_string(pCtx, "&amp;", (int)sizeof("&amp;")-1);
		}else if( c == '<' ){
			/* Expand '&lt;' */
			jx9_result_string(pCtx, "&lt;", (int)sizeof("&lt;")-1);
		}else if( c == '>' ){
			/* Expand '&gt;' */
			jx9_result_string(pCtx, "&gt;", (int)sizeof("&gt;")-1);
		}else if( c == '\'' ){
			if( iFlags & 0x02 /*ENT_QUOTES*/ ){
				/* Expand '&#039;' */
				jx9_result_string(pCtx, "&#039;", (int)sizeof("&#039;")-1);
			}else{
				/* Leave the single quote untouched */
				jx9_result_string(pCtx, "'", (int)sizeof(char));
			}
		}else if( c == '"' ){
			if( (iFlags & 0x04) == 0 /*ENT_NOQUOTES*/ ){
				/* Expand '&quot;' */
				jx9_result_string(pCtx, "&quot;", (int)sizeof("&quot;")-1);
			}else{
				/* Leave the double quote untouched */
				jx9_result_string(pCtx, "\"", (int)sizeof(char));
			}
		}
		/* Ignore the unsafe HTML character */
		zIn++;
	}
	return JX9_OK;
}